

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O0

int dasm_checkstep(BuildCtx *ctx,int secmatch)

{
  dasm_State *pdVar1;
  uint local_24;
  int i;
  dasm_State *D;
  int secmatch_local;
  BuildCtx *ctx_local;
  
  pdVar1 = ctx->D;
  if (pdVar1->status == 0) {
    for (local_24 = 1; (int)local_24 < 10; local_24 = local_24 + 1) {
      if (0 < pdVar1->lglabels[(int)local_24]) {
        pdVar1->status = local_24 | 0x21000000;
        break;
      }
      pdVar1->lglabels[(int)local_24] = 0;
    }
  }
  if (((pdVar1->status == 0) && (-1 < secmatch)) && (pdVar1->section != pdVar1->sections + secmatch)
     ) {
    pdVar1->status = (uint)(((long)pdVar1->section - (long)pdVar1->sections) / 0x28) | 0x3000000;
  }
  return pdVar1->status;
}

Assistant:

int dasm_checkstep(Dst_DECL, int secmatch)
{
  dasm_State *D = Dst_REF;
  if (D->status == DASM_S_OK) {
    int i;
    for (i = 1; i <= 9; i++) {
      if (D->lglabels[i] > 0) { D->status = DASM_S_UNDEF_L|i; break; }
      D->lglabels[i] = 0;
    }
  }
  if (D->status == DASM_S_OK && secmatch >= 0 &&
      D->section != &D->sections[secmatch])
    D->status = DASM_S_MATCH_SEC|(int)(D->section-D->sections);
  return D->status;
}